

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

char * nlohmann::detail::dtoa_impl::format_buffer
                 (char *buf,int len,int decimal_exponent,int min_exp,int max_exp)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  byte bVar6;
  
  if (-1 < min_exp) {
    __assert_fail("min_exp < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/json/include/nlohmann/json.hpp"
                  ,0x1f96,
                  "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
  }
  if (0 < max_exp) {
    uVar1 = decimal_exponent + len;
    if (max_exp < (int)uVar1 || decimal_exponent < 0) {
      if ((int)uVar1 < 1 || max_exp < (int)uVar1) {
        if ((int)uVar1 < 1 && min_exp < (int)uVar1) {
          memmove(buf + (2 - uVar1),buf,(long)len);
          buf[0] = '0';
          buf[1] = '.';
          memset(buf + 2,0x30,(ulong)-uVar1);
          pcVar3 = buf + (int)((2 - uVar1) + len);
        }
        else {
          if (len != 1) {
            memmove(buf + 2,buf + 1,(long)(len + -1));
            buf[1] = '.';
            buf = buf + len;
          }
          buf[1] = 'e';
          if ((int)uVar1 < -0x3e6) {
            __assert_fail("e > -1000",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/json/include/nlohmann/json.hpp"
                          ,0x1f63,"char *nlohmann::detail::dtoa_impl::append_exponent(char *, int)")
            ;
          }
          if (1000 < (int)uVar1) {
            __assert_fail("e < 1000",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/json/include/nlohmann/json.hpp"
                          ,0x1f64,"char *nlohmann::detail::dtoa_impl::append_exponent(char *, int)")
            ;
          }
          uVar5 = uVar1 - 1;
          uVar2 = -uVar5;
          if (0 < (int)uVar5) {
            uVar2 = uVar5;
          }
          buf[2] = ((int)uVar1 < 1) * '\x02' + '+';
          if (uVar2 < 10) {
            buf[3] = '0';
          }
          else {
            if (99 < uVar2) {
              buf[3] = (char)(uVar2 / 100) + '0';
              bVar6 = (byte)((ulong)(uVar2 % 100) * 0x1999999a >> 0x20);
              buf[4] = bVar6 | 0x30;
              buf[5] = (char)(uVar2 % 100) + bVar6 * -10 | 0x30;
              return buf + 6;
            }
            buf[3] = (byte)((ulong)uVar2 / 10) | 0x30;
            uVar2 = uVar2 + (uVar2 / 10 + uVar2 / 10) * -5;
          }
          buf[4] = (byte)uVar2 | 0x30;
          pcVar3 = buf + 5;
        }
      }
      else {
        if (-1 < decimal_exponent) {
          __assert_fail("k > n",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/json/include/nlohmann/json.hpp"
                        ,0x1fb1,
                        "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)"
                       );
        }
        memmove(buf + uVar1 + 1,buf + uVar1,(long)-decimal_exponent);
        buf[uVar1] = '.';
        pcVar3 = buf + (long)len + 1;
      }
    }
    else {
      memset(buf + len,0x30,(ulong)(uint)decimal_exponent);
      pcVar4 = buf + (int)uVar1;
      pcVar3 = pcVar4 + 2;
      pcVar4[0] = '.';
      pcVar4[1] = '0';
    }
    return pcVar3;
  }
  __assert_fail("max_exp > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/json/include/nlohmann/json.hpp"
                ,0x1f97,
                "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
}

Assistant:

inline char* format_buffer(char* buf, int len, int decimal_exponent,
int min_exp, int max_exp)
{
assert(min_exp < 0);
assert(max_exp > 0);

const int k = len;
const int n = len + decimal_exponent;

// v = buf * 10^(n-k)
// k is the length of the buffer (number of decimal digits)
// n is the position of the decimal point relative to the start of the buffer.

if (k <= n and n <= max_exp)
{
// digits[000]
// len <= max_exp + 2

std::memset(buf + k, '0', static_cast<size_t>(n - k));
// Make it look like a floating-point number (#362, #378)
buf[n + 0] = '.';
buf[n + 1] = '0';
return buf + (n + 2);
}

if (0 < n and n <= max_exp)
{
// dig.its
// len <= max_digits10 + 1

assert(k > n);

std::memmove(buf + (n + 1), buf + n, static_cast<size_t>(k - n));
buf[n] = '.';
return buf + (k + 1);
}

if (min_exp < n and n <= 0)
{
// 0.[000]digits
// len <= 2 + (-min_exp - 1) + max_digits10

std::memmove(buf + (2 + -n), buf, static_cast<size_t>(k));
buf[0] = '0';
buf[1] = '.';
std::memset(buf + 2, '0', static_cast<size_t>(-n));
return buf + (2 + (-n) + k);
}

if (k == 1)
{
// dE+123
// len <= 1 + 5

buf += 1;
}
else
{
// d.igitsE+123
// len <= max_digits10 + 1 + 5

std::memmove(buf + 2, buf + 1, static_cast<size_t>(k - 1));
buf[1] = '.';
buf += 1 + k;
}

*buf++ = 'e';
return append_exponent(buf, n - 1);
}